

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effect3d.cpp
# Opt level: O2

int __thiscall
LREffect::draw(LREffect *this,Mat *image,vector<Object,_std::allocator<Object>_> *objects)

{
  char cVar1;
  pointer pOVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  undefined8 extraout_RAX;
  int y;
  long lVar7;
  int j;
  ulong uVar8;
  Matx<double,_4,_1> local_e8;
  ulong local_c0;
  int local_b8;
  int local_b4;
  int local_b0 [2];
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> points;
  undefined4 local_88 [2];
  Mat *local_80;
  undefined8 local_78;
  ulong local_70;
  vector<Object,_std::allocator<Object>_> *local_68;
  Point_<int> local_60;
  Point_<int> local_58;
  int local_50;
  int local_4c;
  int local_48;
  undefined4 local_44;
  int local_40;
  int local_3c;
  int local_38;
  undefined4 local_34;
  
  local_68 = objects;
  poVar6 = std::operator<<((ostream *)&std::cout,"----Left to right effect----");
  std::endl<char,std::char_traits<char>>(poVar6);
  iVar5 = *(int *)(image + 0xc) / 3;
  iVar3 = iVar5 * 2;
  local_c0 = 0;
  for (uVar8 = 0;
      pOVar2 = (local_68->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar8 < (ulong)(((long)(local_68->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl
                             .super__Vector_impl_data._M_finish - (long)pOVar2) / 0x90);
      uVar8 = uVar8 + 1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"obj.prob ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pOVar2[uVar8].prob);
    std::endl<char,std::char_traits<char>>(poVar6);
    if (0.5 < pOVar2[uVar8].prob || pOVar2[uVar8].prob == 0.5) {
      points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.val[0] = (double)CONCAT44(1,iVar5);
      local_70 = uVar8;
      std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&points,
                 (Point_<int> *)&local_e8);
      bVar4 = false;
      for (lVar7 = 0; lVar7 < *(int *)(image + 8); lVar7 = lVar7 + 1) {
        cVar1 = *(char *)((long)iVar5 +
                         **(long **)&pOVar2[uVar8].field_0x78 * lVar7 +
                         *(long *)&pOVar2[uVar8].field_0x40);
        if (cVar1 == '\0') {
          if (bVar4) {
            local_e8.val[0] = (double)CONCAT44((int)lVar7,iVar5);
            std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
            emplace_back<cv::Point_<int>>
                      ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&points,
                       (Point_<int> *)&local_e8);
            bVar4 = false;
          }
        }
        else if ((cVar1 == -1) && (!bVar4)) {
          local_e8.val[0] = (double)CONCAT44((int)lVar7,iVar5);
          std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
          emplace_back<cv::Point_<int>>
                    ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&points,
                     (Point_<int> *)&local_e8);
          bVar4 = true;
        }
      }
      local_e8.val[0] = (double)CONCAT44(*(int *)(image + 8) + -1,iVar5);
      std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&points,
                 (Point_<int> *)&local_e8);
      for (lVar7 = 0; local_80 = image,
          lVar7 < (int)((ulong)((long)points.
                                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)points.
                                     super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar7 = lVar7 + 2) {
        local_78 = 0;
        local_88[0] = 0x3010000;
        local_58 = points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar7];
        local_60 = points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar7 + 1];
        cv::Matx<double,_4,_1>::Matx(&local_e8);
        local_e8.val[0] = 255.0;
        local_e8.val[1] = 255.0;
        local_e8.val[2] = 255.0;
        local_e8.val[3] = 0.0;
        cv::line(local_88,&local_58,&local_60,(Point_<int> *)&local_e8,4,0xffffffffffffffff,0);
      }
      local_78 = 0;
      local_88[0] = 0x3010000;
      local_b0[1] = 1;
      local_b4 = *(int *)(image + 8) + -1;
      local_b8 = iVar3;
      local_b0[0] = iVar3;
      cv::Matx<double,_4,_1>::Matx(&local_e8);
      local_e8.val[0] = 255.0;
      local_e8.val[1] = 255.0;
      local_e8.val[2] = 255.0;
      local_e8.val[3] = 0.0;
      cv::line(local_88,local_b0,&local_b8,(Point_<int> *)&local_e8,4,0xffffffffffffffff,0);
      std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
                ((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&points);
      local_c0 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      uVar8 = local_70;
    }
  }
  if ((local_c0 & 1) == 0) {
    points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(points.
                           super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x3010000);
    local_3c = *(int *)(image + 8) + -1;
    points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)image;
    local_40 = iVar5;
    local_38 = iVar5;
    local_34 = 1;
    cv::Matx<double,_4,_1>::Matx(&local_e8);
    local_e8.val[0] = 255.0;
    local_e8.val[1] = 255.0;
    local_e8.val[2] = 255.0;
    local_e8.val[3] = 0.0;
    cv::line(&points,&local_38,&local_40,&local_e8,4,0xffffffffffffffff,0);
    points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(points.
                           super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x3010000);
    local_4c = *(int *)(image + 8) + -1;
    points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)image;
    local_50 = iVar3;
    local_48 = iVar3;
    local_44 = 1;
    cv::Matx<double,_4,_1>::Matx(&local_e8);
    local_e8.val[0] = 255.0;
    local_e8.val[1] = 255.0;
    local_e8.val[2] = 255.0;
    local_e8.val[3] = 0.0;
    cv::line(&points,&local_48,&local_50,&local_e8,4,0xffffffff,0);
  }
  return 0;
}

Assistant:

int LREffect::draw(cv::Mat& image, const std::vector<Object>& objects) 
{
    std::cout << "----Left to right effect----" << std::endl;

    int left_x = image.cols/3;
    int right_x = image.cols/3*2;

    bool has_major_obj = false;

    for (size_t i = 0; i < objects.size(); i++)
    {
        const Object& obj = objects[i];
//            float ratio = obj.rect.area() / (image.rows * image.cols);
        std::cout << "obj.prob " << obj.prob << std::endl;

        if (obj.prob < 0.5 ) 
        {
            continue;
        }

        has_major_obj = true;
        // draw white line

        // left line
        std::vector<cv::Point> points;
        points.emplace_back(cv::Point(left_x, 1));
        bool is_mask = false;

        for (int y = 0; y < image.rows; y++)
        {
            const uchar* mp = obj.mask.ptr(y);
            if (mp[left_x] == 255 && !is_mask)
            {
                is_mask = true;
                points.emplace_back(cv::Point(left_x, y));
            }
            else if (mp[left_x] == 0 && is_mask)
            {
                is_mask = false;
                points.emplace_back(cv::Point(left_x, y));
            }
        }
        points.emplace_back(cv::Point(left_x, image.rows - 1));

        for (int j = 0; j < (int)points.size(); j += 2)
        {
            cv::line(image, points[j], points[j + 1], cv::Scalar(255, 255, 255), 4, -1);
        }

        // right line
        cv::line(image, cv::Point(right_x, 1), cv::Point(right_x, image.rows - 1), cv::Scalar(255,255,255), 4, -1);
    }

    if (!has_major_obj)
    {
        cv::line(image, cv::Point(left_x, 1), cv::Point(left_x, image.rows - 1),
                    cv::Scalar(255,255,255), 4, -1);
        cv::line(image, cv::Point(right_x, 1), cv::Point(right_x, image.rows - 1),
                    cv::Scalar(255,255,255), 4, -1);
    }
    return 0;
}